

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::prepareNextTestCase
          (ImplicitConversionsValidTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  GLchar *pGVar1;
  bool bVar2;
  pointer ptVar3;
  undefined1 local_1a0 [384];
  
  this->m_current_test_case_index = test_case_index;
  bVar2 = true;
  if (test_case_index != 0xffffffff) {
    ptVar3 = (this->m_test_cases).
             super__Vector_base<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)test_case_index <
        (ulong)((long)(this->m_test_cases).
                      super__Vector_base<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3 >> 4)) {
      local_1a0._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"T1:");
      ptVar3 = ptVar3 + test_case_index;
      pGVar1 = Utils::getTypeName((ptVar3->m_types).m_t1,ptVar3->m_n_cols,ptVar3->m_n_rows);
      std::operator<<((ostream *)this_00,pGVar1);
      std::operator<<((ostream *)this_00," T2:");
      pGVar1 = Utils::getTypeName((ptVar3->m_types).m_t2,ptVar3->m_n_cols,ptVar3->m_n_rows);
      std::operator<<((ostream *)this_00,pGVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ImplicitConversionsValidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const testCase& test_case = m_test_cases[test_case_index];

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "T1:" << Utils::getTypeName(test_case.m_types.m_t1, test_case.m_n_cols,
																	   test_case.m_n_rows)
										<< " T2:" << Utils::getTypeName(test_case.m_types.m_t2, test_case.m_n_cols,
																		test_case.m_n_rows)
										<< tcu::TestLog::EndMessage;

	return true;
}